

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

void test_compile_program(void)

{
  ostream *poVar1;
  Machine local_518;
  vector<Inst,_std::allocator<Inst>_> local_4a8;
  Machine local_490;
  Machine local_420;
  FOTerm local_3b0;
  FOTerm local_370;
  map<Register,_FOTermFlattened,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  local_330;
  undefined1 local_300 [8];
  vector<Inst,_std::allocator<Inst>_> is;
  FOTerm local_2e0;
  int local_29c;
  FOTerm local_298;
  FOTerm local_258;
  FOTerm local_218;
  undefined1 local_1d8 [8];
  Flattener f;
  Machine m;
  undefined1 local_88 [8];
  FOTerm p;
  FOTerm q;
  
  test_create_query();
  test_create_program();
  std::operator<<((ostream *)&std::cout,"*** TEST_COMPILE_PROGRAM ***\n");
  Machine::Machine((Machine *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Flattener::Flattener((Flattener *)local_1d8);
  poVar1 = std::operator<<((ostream *)&std::cout,"*** flattened query: ");
  FOTerm::FOTerm(&local_218,(FOTerm *)&p.field_0x38);
  poVar1 = operator<<(poVar1,&local_218);
  poVar1 = std::operator<<(poVar1," | program: ");
  FOTerm::FOTerm(&local_258,(FOTerm *)local_88);
  poVar1 = operator<<(poVar1,&local_258);
  std::operator<<(poVar1," ***\n");
  FOTerm::~FOTerm(&local_258);
  FOTerm::~FOTerm(&local_218);
  FOTerm::FOTerm(&local_298,(FOTerm *)&p.field_0x38);
  local_29c = (int)flatten((Flattener *)local_1d8,&local_298);
  FOTerm::~FOTerm(&local_298);
  FOTerm::FOTerm(&local_2e0,(FOTerm *)local_88);
  is.super__Vector_base<Inst,_std::allocator<Inst>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = flatten((Flattener *)local_1d8,&local_2e0);
  FOTerm::~FOTerm(&local_2e0);
  std::operator<<((ostream *)&std::cout,"*** flattened representation (page 15) ***\n");
  printMap<Register,FOTermFlattened>
            ((ostream *)&std::cout,
             (map<Register,_FOTermFlattened,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
              *)&f.var2reg._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<Register,_FOTermFlattened,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  ::map(&local_330,
        (map<Register,_FOTermFlattened,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
         *)&f.var2reg._M_t._M_impl.super__Rb_tree_header._M_node_count);
  compileQuery((vector<Inst,_std::allocator<Inst>_> *)local_300,&local_330);
  std::
  map<Register,_FOTermFlattened,_std::less<Register>,_std::allocator<std::pair<const_Register,_FOTermFlattened>_>_>
  ::~map(&local_330);
  poVar1 = std::operator<<((ostream *)&std::cout,"*** Running program ");
  FOTerm::FOTerm(&local_370,(FOTerm *)local_88);
  poVar1 = operator<<(poVar1,&local_370);
  poVar1 = std::operator<<(poVar1,"On query ");
  FOTerm::FOTerm(&local_3b0,(FOTerm *)&p.field_0x38);
  poVar1 = operator<<(poVar1,&local_3b0);
  std::operator<<(poVar1,"***\n");
  FOTerm::~FOTerm(&local_3b0);
  FOTerm::~FOTerm(&local_370);
  Machine::Machine(&local_490,(Machine *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<Inst,_std::allocator<Inst>_>::vector
            (&local_4a8,(vector<Inst,_std::allocator<Inst>_> *)local_300);
  runInsts(&local_420,&local_490,&local_4a8);
  Machine::operator=((Machine *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_420)
  ;
  Machine::~Machine(&local_420);
  std::vector<Inst,_std::allocator<Inst>_>::~vector(&local_4a8);
  Machine::~Machine(&local_490);
  std::operator<<((ostream *)&std::cout,"*** final state:**\n");
  Machine::Machine(&local_518,(Machine *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count);
  prettyPrintMachine(&local_518);
  Machine::~Machine(&local_518);
  std::vector<Inst,_std::allocator<Inst>_>::~vector
            ((vector<Inst,_std::allocator<Inst>_> *)local_300);
  Flattener::~Flattener((Flattener *)local_1d8);
  Machine::~Machine((Machine *)&f.flat._M_t._M_impl.super__Rb_tree_header._M_node_count);
  FOTerm::~FOTerm((FOTerm *)local_88);
  FOTerm::~FOTerm((FOTerm *)&p.field_0x38);
  return;
}

Assistant:

void test_compile_program() {
    const FOTerm q = test_create_query();
    const FOTerm p = test_create_program();
    std::cout << "*** TEST_COMPILE_PROGRAM ***\n";

    Machine m;
    Flattener f;

    {

        // std::cout << "*** Machine state after compiling query: " << q
        //           << " ***\n";
        // prettyPrintMachine(m);
    }

    std::cout << "*** flattened query: " << q << " | program: " << p << " ***\n";
    (void)flatten(f, q);
    (void)flatten(f, p);

    std::cout << "*** flattened representation (page 15) ***\n";
    printMap(std::cout, f.flat);

    std::vector<Inst> is = compileQuery(f.flat);
    std::cout << "*** Running program " << p << "On query " << q << "***\n";
    m = runInsts(m, is);

    std::cout << "*** final state:**\n";
    prettyPrintMachine(m);
        // runInstsPrettyPrint(std::cout, m, is);

}